

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersennetwister.h
# Opt level: O1

uint32 MTRand::hash(time_t t,clock_t c)

{
  uint32 uVar1;
  long lVar2;
  size_t i;
  long lVar3;
  ulong uVar4;
  size_t j;
  clock_t c_local;
  time_t t_local;
  
  uVar1 = hash::differ;
  t_local = t;
  c_local = c;
  lVar3 = 0;
  lVar2 = 0;
  do {
    lVar2 = (ulong)*(byte *)((long)&t_local + lVar3) + lVar2 * 0x101;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  lVar3 = 0;
  uVar4 = 0;
  do {
    uVar4 = (ulong)*(byte *)((long)&c_local + lVar3) + uVar4 * 0x101;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  hash::differ = hash::differ + 1;
  return lVar2 + uVar1 ^ uVar4;
}

Assistant:

MTRand::uint32 MTRand::hash(time_t t, clock_t c) {
  // Get a uint32 from t and c
  // Better than uint32(x) in case x is floating point in [0,1]
  // Based on code by Lawrence Kirby (fred@genesis.demon.co.uk)

  static uint32 differ = 0; // guarantee time-based seeds will change

  uint32 h1 = 0;
  unsigned char *p = reinterpret_cast<unsigned char *>(&t);
  for (size_t i = 0; i < sizeof(t); ++i) {
    h1 *= UCHAR_MAX + 2U;
    h1 += p[i];
  }
  uint32 h2 = 0;
  p = reinterpret_cast<unsigned char *>(&c);
  for (size_t j = 0; j < sizeof(c); ++j) {
    h2 *= UCHAR_MAX + 2U;
    h2 += p[j];
  }
  return (h1 + differ++) ^ h2;
}